

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_unpack(lua_State *L)

{
  size_t totalsize;
  KOption KVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  lua_Integer n;
  float f;
  size_t ld;
  Header h;
  int ntoalign;
  int size;
  char *fmt;
  ulong local_58;
  Header local_50;
  int local_40;
  int local_3c;
  char *local_38;
  
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  local_38 = pcVar3;
  luaL_checklstring(L,2,&local_58);
  lVar4 = luaL_optinteger(L,3,1);
  n = lVar4;
  if ((lVar4 < 1) &&
     (n = 1, SBORROW8(lVar4,-local_58) == (long)(lVar4 + local_58) < 0 && lVar4 != 0)) {
    n = lVar4 + local_58 + 1;
  }
  totalsize = n - 1;
  if (local_58 < totalsize) {
    luaL_argerror(L,3,"initial position out of string");
  }
  local_50.islittle = 1;
  local_50.maxalign = 1;
  local_50.L = L;
  if (*pcVar3 != '\0') {
    KVar1 = getdetails(&local_50,totalsize,&local_38,&local_3c,&local_40);
    if (local_58 - totalsize < (ulong)((long)local_40 + (long)local_3c)) {
      luaL_argerror(L,2,"data string too short");
    }
    luaL_checkstack(L,2,"too many results");
    iVar2 = (*(code *)(&DAT_0012f238 + *(int *)(&DAT_0012f238 + (ulong)KVar1 * 4)))();
    return iVar2;
  }
  lua_pushinteger(L,n);
  return 1;
}

Assistant:

static int str_unpack (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);
  size_t ld;
  const char *data = luaL_checklstring(L, 2, &ld);
  size_t pos = posrelatI(luaL_optinteger(L, 3, 1), ld) - 1;
  int n = 0;  /* number of results */
  luaL_argcheck(L, pos <= ld, 3, "initial position out of string");
  initheader(L, &h);
  while (*fmt != '\0') {
    int size, ntoalign;
    KOption opt = getdetails(&h, pos, &fmt, &size, &ntoalign);
    luaL_argcheck(L, (size_t)ntoalign + size <= ld - pos, 2,
                    "data string too short");
    pos += ntoalign;  /* skip alignment */
    /* stack space for item + next position */
    luaL_checkstack(L, 2, "too many results");
    n++;
    switch (opt) {
      case Kint:
      case Kuint: {
        lua_Integer res = unpackint(L, data + pos, h.islittle, size,
                                       (opt == Kint));
        lua_pushinteger(L, res);
        break;
      }
      case Kfloat: {
        float f;
        copywithendian((char *)&f, data + pos, sizeof(f), h.islittle);
        lua_pushnumber(L, (lua_Number)f);
        break;
      }
      case Knumber: {
        lua_Number f;
        copywithendian((char *)&f, data + pos, sizeof(f), h.islittle);
        lua_pushnumber(L, f);
        break;
      }
      case Kdouble: {
        double f;
        copywithendian((char *)&f, data + pos, sizeof(f), h.islittle);
        lua_pushnumber(L, (lua_Number)f);
        break;
      }
      case Kchar: {
        lua_pushlstring(L, data + pos, size);
        break;
      }
      case Kstring: {
        size_t len = (size_t)unpackint(L, data + pos, h.islittle, size, 0);
        luaL_argcheck(L, len <= ld - pos - size, 2, "data string too short");
        lua_pushlstring(L, data + pos + size, len);
        pos += len;  /* skip string */
        break;
      }
      case Kzstr: {
        size_t len = strlen(data + pos);
        luaL_argcheck(L, pos + len < ld, 2,
                         "unfinished string for format 'z'");
        lua_pushlstring(L, data + pos, len);
        pos += len + 1;  /* skip string plus final '\0' */
        break;
      }
      case Kpaddalign: case Kpadding: case Knop:
        n--;  /* undo increment */
        break;
    }
    pos += size;
  }
  lua_pushinteger(L, pos + 1);  /* next position */
  return n + 1;
}